

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O1

FreePageEntry * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::BackgroundPageQueue::PopFreePageEntry(BackgroundPageQueue *this)

{
  FreePageEntry *pFVar1;
  
  CCLock::Enter(&(this->backgroundPageQueueCriticalSection).super_CCLock);
  pFVar1 = this->bgFreePageList;
  if (pFVar1 != (FreePageEntry *)0x0) {
    this->bgFreePageList = pFVar1->Next;
  }
  CCLock::Leave(&(this->backgroundPageQueueCriticalSection).super_CCLock);
  return pFVar1;
}

Assistant:

FreePageEntry* PopFreePageEntry()
        {
#if SUPPORT_WIN32_SLIST
            return (FreePageEntry *)::InterlockedPopEntrySList(&bgFreePageList);
#else
            AutoCriticalSection autoCS(&backgroundPageQueueCriticalSection);
            FreePageEntry* head = bgFreePageList;
            if (head)
            {
                bgFreePageList = bgFreePageList->Next;
            }
            return head;
#endif
        }